

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.cpp
# Opt level: O1

int musl_getopt_long_only(int argc,char **argv,char *optstring,option *longopts,int *idx)

{
  option *poVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  char **ppcVar8;
  size_t l;
  size_t l_00;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  wchar_t wVar19;
  char *pcVar20;
  long lVar21;
  bool bVar22;
  wchar_t d;
  wchar_t c;
  char *local_60;
  ulong local_50;
  wchar_t local_48;
  wchar_t local_44;
  int *local_40;
  ulong local_38;
  
  if ((musl_optind == 0) || (musl_optreset != 0)) {
    musl_optreset = 0;
    musl_optpos = 0;
    musl_optind = 1;
  }
  iVar3 = musl_optind;
  if (argc <= musl_optind) {
    return -1;
  }
  lVar21 = (long)musl_optind;
  if (argv[lVar21] == (char *)0x0) {
    return -1;
  }
  iVar10 = musl_optind;
  if ((*optstring != '+') && (*optstring != '-')) {
    ppcVar8 = argv + lVar21;
    while( true ) {
      pcVar17 = *ppcVar8;
      if (pcVar17 == (char *)0x0) {
        return -1;
      }
      if ((*pcVar17 == '-') && (pcVar17[1] != '\0')) break;
      iVar10 = iVar10 + 1;
      ppcVar8 = ppcVar8 + 1;
      if (argc == iVar10) {
        return -1;
      }
    }
  }
  musl_optind = iVar10;
  iVar10 = musl_optind;
  musl_optarg = (char *)0x0;
  if ((((longopts != (option *)0x0) && (pcVar17 = argv[musl_optind], *pcVar17 == '-')) &&
      (cVar2 = pcVar17[1], cVar2 != '\0')) && ((cVar2 != '-' || (pcVar17[2] != '\0')))) {
    pcVar20 = pcVar17 + 1;
    pcVar14 = longopts->name;
    if (pcVar14 == (char *)0x0) {
      iVar4 = 0;
      local_50._0_4_ = 0;
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar16 = pcVar17 + 2;
      if (cVar2 != '-') {
        pcVar16 = pcVar20;
      }
      uVar11 = 0;
      pcVar17 = (char *)0x0;
      local_50 = 0;
      iVar4 = 0;
      pcVar18 = pcVar16;
LAB_00115ee4:
      do {
        cVar2 = *pcVar18;
        if ((cVar2 == '\0') || (cVar2 == '=')) {
LAB_00115f0c:
          iVar4 = iVar4 + 1;
          bVar22 = *pcVar14 == '\0';
          if (bVar22) {
            iVar4 = 1;
          }
          local_50 = uVar11 & 0xffffffff;
          pcVar17 = pcVar18;
        }
        else {
          if (cVar2 == *pcVar14) {
            pcVar14 = pcVar14 + 1;
            pcVar18 = pcVar18 + 1;
            goto LAB_00115ee4;
          }
          if ((cVar2 == '\0') || (cVar2 == '=')) goto LAB_00115f0c;
          bVar22 = false;
        }
        if (bVar22) break;
        uVar11 = uVar11 + 1;
        pcVar14 = longopts[uVar11].name;
        pcVar18 = pcVar16;
      } while (pcVar14 != (char *)0x0);
    }
    cVar2 = optstring[(*optstring - 0x2bU & 0xfd) == 0];
    local_40 = idx;
    if (iVar4 == 1) {
      local_38 = (long)pcVar17 - (long)pcVar20;
      iVar5 = mblen(pcVar20,0x10);
      iVar4 = 1;
      if ((local_38 == (long)iVar5) && (*optstring != '\0')) {
        iVar5 = (int)local_38;
        iVar4 = 1;
        uVar11 = 1;
        if (1 < iVar5) {
          uVar11 = local_38 & 0xffffffff;
        }
        lVar13 = 0;
        pcVar14 = optstring;
        do {
          uVar9 = 0;
          if (0 < (long)local_38) {
            uVar12 = 0;
            do {
              uVar9 = uVar12;
              if (pcVar20[uVar12] != pcVar14[uVar12]) break;
              uVar12 = uVar12 + 1;
              uVar9 = uVar11;
            } while (uVar11 != uVar12);
          }
          iVar4 = iVar4 + (uint)((int)uVar9 == iVar5);
          if ((int)uVar9 == iVar5) break;
          pcVar14 = pcVar14 + 1;
          lVar15 = lVar13 + 1;
          lVar13 = lVar13 + 1;
        } while (optstring[lVar15] != '\0');
      }
    }
    if (iVar4 == 1) {
      iVar4 = musl_optind + 1;
      lVar13 = (long)(int)local_50;
      poVar1 = longopts + lVar13;
      if (*pcVar17 == '=') {
        if (longopts[lVar13].has_arg == 0) {
          bVar22 = false;
          musl_optopt = poVar1->val;
          pcVar20 = (char *)0x3f;
          musl_optind = iVar4;
          if ((cVar2 != ':') && (musl_opterr != 0)) {
            local_60 = *argv;
            pcVar17 = poVar1->name;
            l = strlen(pcVar17);
            pcVar20 = ": option does not take an argument: ";
LAB_0011643b:
            musl_getopt_msg(local_60,pcVar20,pcVar17,l);
            goto LAB_001160c9;
          }
          goto LAB_00116125;
        }
        musl_optarg = pcVar17 + 1;
      }
      else if (longopts[lVar13].has_arg == 1) {
        musl_optarg = argv[(long)musl_optind + 1];
        if (musl_optarg == (char *)0x0) {
          musl_optopt = poVar1->val;
          if (cVar2 != ':') {
            musl_optind = iVar4;
            if (musl_opterr != 0) {
              local_60 = *argv;
              pcVar17 = poVar1->name;
              l = strlen(pcVar17);
              pcVar20 = ": option requires an argument: ";
              goto LAB_0011643b;
            }
            goto LAB_001160c9;
          }
          bVar22 = false;
          pcVar20 = (char *)0x3a;
          musl_optind = iVar4;
          goto LAB_00116125;
        }
        iVar4 = musl_optind + 2;
      }
      musl_optind = iVar4;
      if (local_40 != (int *)0x0) {
        *local_40 = (int)local_50;
      }
      bVar22 = false;
      pcVar20 = (char *)(ulong)(uint)longopts[lVar13].val;
      if ((uint *)longopts[lVar13].flag != (uint *)0x0) {
        *longopts[lVar13].flag = longopts[lVar13].val;
        pcVar20 = (char *)0x0;
      }
    }
    else if (argv[musl_optind][1] == '-') {
      musl_optopt = 0;
      if ((cVar2 != ':') && (musl_opterr != 0)) {
        pcVar17 = *argv;
        pcVar20 = ": option is ambiguous: ";
        if (iVar4 == 0) {
          pcVar20 = ": unrecognized option: ";
        }
        pcVar14 = argv[musl_optind] + 2;
        l_00 = strlen(pcVar14);
        musl_getopt_msg(pcVar17,pcVar20,pcVar14,l_00);
      }
      musl_optind = musl_optind + 1;
LAB_001160c9:
      pcVar20 = (char *)0x3f;
      bVar22 = false;
    }
    else {
      bVar22 = true;
    }
LAB_00116125:
    wVar19 = (wchar_t)pcVar20;
    if (!bVar22) goto LAB_00116398;
  }
  if ((musl_optind == 0) || (musl_optreset != 0)) {
    musl_optreset = 0;
    musl_optpos = 0;
    musl_optind = 1;
  }
  wVar19 = L'\xffffffff';
  if ((musl_optind < argc) && (pcVar17 = argv[musl_optind], pcVar17 != (char *)0x0)) {
    if (*pcVar17 == '-') {
      if (pcVar17[1] != '\0') {
        if ((pcVar17[1] == '-') && (pcVar17[2] == '\0')) {
          musl_optind = musl_optind + 1;
        }
        else {
          if (musl_optpos == 0) {
            musl_optpos = 1;
          }
          uVar6 = mbtowc(&local_44,pcVar17 + (uint)musl_optpos,0x10);
          if ((int)uVar6 < 0) {
            local_44 = L'�';
            uVar6 = 1;
          }
          pcVar17 = argv[musl_optind];
          uVar11 = (ulong)(uint)musl_optpos;
          lVar13 = uVar6 + uVar11;
          musl_optpos = (int)lVar13;
          if (pcVar17[lVar13] == '\0') {
            musl_optind = musl_optind + 1;
            musl_optpos = 0;
          }
          if ((*optstring == '-') || (*optstring == '+')) {
            optstring = optstring + 1;
          }
          local_48 = L'\0';
          uVar9 = 0;
          do {
            uVar7 = mbtowc(&local_48,optstring + (uVar9 & 0xffffffff),0x10);
            uVar12 = 1;
            if (1 < (int)uVar7) {
              uVar12 = (ulong)uVar7;
            }
            uVar9 = uVar12 + (uVar9 & 0xffffffff);
          } while ((uVar7 != 0) && (local_48 != local_44));
          if (local_48 == local_44 && local_44 != L':') {
            wVar19 = local_44;
            if (optstring[uVar9] != ':') goto LAB_00116398;
            musl_optarg = (char *)0x0;
            if (musl_optpos != 0 || optstring[uVar9 + 1] != ':') {
              lVar13 = (long)musl_optind;
              musl_optind = musl_optind + 1;
              musl_optarg = argv[lVar13] + (uint)musl_optpos;
              musl_optpos = 0;
            }
            if (musl_optind <= argc) goto LAB_00116398;
            musl_optopt = local_44;
            wVar19 = L':';
            if ((*optstring == ':') || (wVar19 = L'?', musl_opterr == 0)) goto LAB_00116398;
            pcVar20 = *argv;
            pcVar14 = ": option requires an argument: ";
          }
          else {
            musl_optopt = local_44;
            wVar19 = L'?';
            if ((*optstring == ':') || (musl_opterr == 0)) goto LAB_00116398;
            pcVar20 = *argv;
            pcVar14 = ": unrecognized option: ";
          }
          musl_optopt = local_44;
          musl_getopt_msg(pcVar20,pcVar14,pcVar17 + uVar11,(ulong)uVar6);
          wVar19 = L'?';
        }
      }
    }
    else if (*optstring == '-') {
      musl_optind = musl_optind + 1;
      wVar19 = L'\x01';
      musl_optarg = pcVar17;
    }
  }
LAB_00116398:
  if (iVar3 < iVar10) {
    iVar4 = musl_optind - iVar10;
    if (iVar4 != 0 && iVar10 <= musl_optind) {
      lVar13 = (long)musl_optind + -1;
      iVar10 = 0;
      do {
        pcVar17 = argv[(long)musl_optind + -1];
        lVar15 = lVar13;
        if (iVar3 < (int)lVar13) {
          do {
            argv[lVar15] = argv[lVar15 + -1];
            lVar15 = lVar15 + -1;
          } while (lVar21 < lVar15);
        }
        argv[lVar21] = pcVar17;
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar4);
    }
    musl_optind = iVar4 + iVar3;
  }
  return wVar19;
}

Assistant:

int musl_getopt_long_only(int argc, char **argv, char const *optstring,
			  const struct option *longopts, int *idx)
{
	return musl_getopt_long(argc, argv, optstring, longopts, idx, 1);
}